

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::UnsafeShallowSwapField
          (Reflection *this,Message *message1,Message *message2,FieldDescriptor *field)

{
  byte bVar1;
  int iVar2;
  RepeatedField<int> *this_00;
  RepeatedField<int> *other;
  RepeatedField<unsigned_long> *this_01;
  RepeatedField<unsigned_long> *other_00;
  RepeatedField<long> *this_02;
  RepeatedField<long> *other_01;
  RepeatedField<unsigned_int> *this_03;
  RepeatedField<unsigned_int> *other_02;
  RepeatedField<bool> *this_04;
  RepeatedField<bool> *other_03;
  RepeatedField<double> *this_05;
  RepeatedField<double> *other_04;
  RepeatedField<float> *this_06;
  RepeatedField<float> *other_05;
  string_view str;
  LogMessage local_40;
  CppType local_2c;
  
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
    iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
    if ((bVar1 & 0x20) == 0) {
      if (iVar2 == 9) {
        protobuf::internal::SwapFieldHelper::SwapStringField<true>(this,message1,message2,field);
        return;
      }
      if (iVar2 != 10) {
        protobuf::internal::SwapFieldHelper::SwapNonMessageNonStringField
                  (this,message1,message2,field);
        return;
      }
      protobuf::internal::SwapFieldHelper::SwapMessageField<true>(this,message1,message2,field);
      return;
    }
    switch(iVar2) {
    case 1:
    case 8:
      VerifyFieldType<google::protobuf::RepeatedField<int>>(this,field);
      this_00 = (RepeatedField<int> *)MutableRawImpl(this,message1,field);
      VerifyFieldType<google::protobuf::RepeatedField<int>>(this,field);
      other = (RepeatedField<int> *)MutableRawImpl(this,message2,field);
      RepeatedField<int>::InternalSwap(this_00,other);
      return;
    case 2:
      VerifyFieldType<google::protobuf::RepeatedField<long>>(this,field);
      this_02 = (RepeatedField<long> *)MutableRawImpl(this,message1,field);
      VerifyFieldType<google::protobuf::RepeatedField<long>>(this,field);
      other_01 = (RepeatedField<long> *)MutableRawImpl(this,message2,field);
      RepeatedField<long>::InternalSwap(this_02,other_01);
      return;
    case 3:
      VerifyFieldType<google::protobuf::RepeatedField<unsigned_int>>(this,field);
      this_03 = (RepeatedField<unsigned_int> *)MutableRawImpl(this,message1,field);
      VerifyFieldType<google::protobuf::RepeatedField<unsigned_int>>(this,field);
      other_02 = (RepeatedField<unsigned_int> *)MutableRawImpl(this,message2,field);
      RepeatedField<unsigned_int>::InternalSwap(this_03,other_02);
      return;
    case 4:
      VerifyFieldType<google::protobuf::RepeatedField<unsigned_long>>(this,field);
      this_01 = (RepeatedField<unsigned_long> *)MutableRawImpl(this,message1,field);
      VerifyFieldType<google::protobuf::RepeatedField<unsigned_long>>(this,field);
      other_00 = (RepeatedField<unsigned_long> *)MutableRawImpl(this,message2,field);
      RepeatedField<unsigned_long>::InternalSwap(this_01,other_00);
      return;
    case 5:
      VerifyFieldType<google::protobuf::RepeatedField<double>>(this,field);
      this_05 = (RepeatedField<double> *)MutableRawImpl(this,message1,field);
      VerifyFieldType<google::protobuf::RepeatedField<double>>(this,field);
      other_04 = (RepeatedField<double> *)MutableRawImpl(this,message2,field);
      RepeatedField<double>::InternalSwap(this_05,other_04);
      return;
    case 6:
      VerifyFieldType<google::protobuf::RepeatedField<float>>(this,field);
      this_06 = (RepeatedField<float> *)MutableRawImpl(this,message1,field);
      VerifyFieldType<google::protobuf::RepeatedField<float>>(this,field);
      other_05 = (RepeatedField<float> *)MutableRawImpl(this,message2,field);
      RepeatedField<float>::InternalSwap(this_06,other_05);
      return;
    case 7:
      VerifyFieldType<google::protobuf::RepeatedField<bool>>(this,field);
      this_04 = (RepeatedField<bool> *)MutableRawImpl(this,message1,field);
      VerifyFieldType<google::protobuf::RepeatedField<bool>>(this,field);
      other_03 = (RepeatedField<bool> *)MutableRawImpl(this,message2,field);
      RepeatedField<bool>::InternalSwap(this_04,other_03);
      return;
    case 9:
      protobuf::internal::SwapFieldHelper::SwapRepeatedStringField<true>
                (this,message1,message2,field);
      return;
    case 10:
      protobuf::internal::SwapFieldHelper::SwapRepeatedMessageField<true>
                (this,message1,message2,field);
      return;
    default:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x3d3);
      str._M_str = "Unimplemented type: ";
      str._M_len = 0x14;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_40,str);
      local_2c = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
      absl::lts_20250127::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>(&local_40,&local_2c);
    }
  }
  else {
    UnsafeShallowSwapField();
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void Reflection::UnsafeShallowSwapField(Message* message1, Message* message2,
                                        const FieldDescriptor* field) const {
  if (!field->is_repeated()) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      internal::SwapFieldHelper::SwapMessageField<true>(this, message1,
                                                        message2, field);
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      internal::SwapFieldHelper::SwapStringField<true>(this, message1, message2,
                                                       field);
    } else {
      internal::SwapFieldHelper::SwapNonMessageNonStringField(this, message1,
                                                              message2, field);
    }
    return;
  }

  switch (field->cpp_type()) {
#define SHALLOW_SWAP_ARRAYS(CPPTYPE, TYPE)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                \
    MutableRaw<RepeatedField<TYPE>>(message1, field)                      \
        ->InternalSwap(MutableRaw<RepeatedField<TYPE>>(message2, field)); \
    break;

    SHALLOW_SWAP_ARRAYS(INT32, int32_t);
    SHALLOW_SWAP_ARRAYS(INT64, int64_t);
    SHALLOW_SWAP_ARRAYS(UINT32, uint32_t);
    SHALLOW_SWAP_ARRAYS(UINT64, uint64_t);
    SHALLOW_SWAP_ARRAYS(FLOAT, float);
    SHALLOW_SWAP_ARRAYS(DOUBLE, double);
    SHALLOW_SWAP_ARRAYS(BOOL, bool);
    SHALLOW_SWAP_ARRAYS(ENUM, int);
#undef SHALLOW_SWAP_ARRAYS

    case FieldDescriptor::CPPTYPE_STRING:
      internal::SwapFieldHelper::SwapRepeatedStringField<true>(this, message1,
                                                               message2, field);
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      internal::SwapFieldHelper::SwapRepeatedMessageField<true>(
          this, message1, message2, field);
      break;

    default:
      ABSL_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
  }
}